

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_graph_get_parent(ggml_cgraph *cgraph,ggml_tensor *node)

{
  int iVar1;
  ggml_tensor **ppgVar2;
  ggml_tensor *node_00;
  ggml_tensor *pgVar3;
  long lVar4;
  
  iVar1 = cgraph->n_nodes;
  if (0 < (long)iVar1) {
    ppgVar2 = cgraph->nodes;
    lVar4 = 0;
    do {
      node_00 = ppgVar2[lVar4];
      pgVar3 = ggml_graph_get_grad(cgraph,node_00);
      if (pgVar3 == node) {
        return node_00;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return (ggml_tensor *)0x0;
}

Assistant:

static struct ggml_tensor * ggml_graph_get_parent(const struct ggml_cgraph * cgraph, const struct ggml_tensor * node) {
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * parent = cgraph->nodes[i];
        struct ggml_tensor * grad = ggml_graph_get_grad(cgraph, parent);

        if (grad == node) {
            return parent;
        }
    }

    return NULL;
}